

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printfcpp.cpp
# Opt level: O3

BOOL Internal_ExtractFormatA
               (CPalThread *pthrCurrent,LPCSTR *Fmt,LPSTR Out,LPINT Flags,LPINT Width,
               LPINT Precision,LPINT Prefix,LPINT Type)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  int *piVar4;
  byte bVar5;
  byte *pbVar6;
  byte *pbVar7;
  uint uVar8;
  char *pcVar9;
  BOOL BVar10;
  byte *pbVar11;
  
  *Width = -1;
  *Precision = -1;
  *Flags = 0;
  *Prefix = -1;
  *Type = -1;
  pcVar3 = *Fmt;
  if (pcVar3 == (char *)0x0) {
    return 0;
  }
  if (*pcVar3 != '%') {
    return 0;
  }
  *Fmt = pcVar3 + 1;
  *Out = *pcVar3;
  sVar2 = strlen(*Fmt);
  pcVar3 = (char *)CorUnix::InternalMalloc(sVar2 + 1);
  if (pcVar3 != (char *)0x0) {
    do {
      pbVar11 = (byte *)Out + 1;
      pbVar7 = (byte *)*Fmt;
      bVar5 = *pbVar7;
      if (bVar5 < 0x2b) {
        if (bVar5 == 0x20) {
          uVar8 = 8;
        }
        else {
          if (bVar5 != 0x23) goto LAB_0031566c;
          uVar8 = 2;
        }
      }
      else if (bVar5 == 0x30) {
        uVar8 = 4;
      }
      else {
        uVar8 = 1;
        if (bVar5 != 0x2d) {
          if (bVar5 != 0x2b) goto LAB_0031566c;
          uVar8 = 0x10;
        }
      }
      *Flags = *Flags | uVar8;
      *Fmt = (LPCSTR)(pbVar7 + 1);
      *pbVar11 = *pbVar7;
      Out = (LPSTR)pbVar11;
    } while( true );
  }
  if (PAL_InitializeChakraCoreCalled != false) {
    piVar4 = __errno_location();
    *piVar4 = 8;
    return 0;
  }
  goto LAB_00315ac9;
LAB_0031566c:
  if ((~*Flags & 5U) == 0) {
    *Flags = *Flags - 4;
    bVar5 = *pbVar7;
  }
  iVar1 = isdigit((uint)bVar5);
  pbVar7 = (byte *)*Fmt;
  if (iVar1 != 0) {
    iVar1 = isdigit((uint)*pbVar7);
    pcVar9 = pcVar3;
    while (iVar1 != 0) {
      *pcVar9 = **Fmt;
      pcVar9 = pcVar9 + 1;
      pbVar7 = (byte *)*Fmt;
      *Fmt = (LPCSTR)(pbVar7 + 1);
      *pbVar11 = *pbVar7;
      pbVar11 = pbVar11 + 1;
      iVar1 = isdigit((uint)(byte)**Fmt);
    }
    *pcVar9 = '\0';
    iVar1 = atoi(pcVar3);
    *Width = iVar1;
    if (-1 < iVar1) goto LAB_00315761;
LAB_003157e4:
    if (PAL_InitializeChakraCoreCalled != false) {
      piVar4 = __errno_location();
      *piVar4 = 0x54f;
      return 0;
    }
LAB_00315ac9:
    abort();
  }
  if (*pbVar7 == 0x2a) {
    *Width = -2;
    *Fmt = (LPCSTR)(pbVar7 + 1);
    *pbVar11 = *pbVar7;
    pbVar11 = (byte *)Out + 2;
    iVar1 = isdigit((uint)(byte)**Fmt);
    if (iVar1 != 0) {
      *Width = -3;
      while (iVar1 = isdigit((uint)(byte)**Fmt), iVar1 != 0) {
        pbVar7 = (byte *)*Fmt;
        *Fmt = (LPCSTR)(pbVar7 + 1);
        *pbVar11 = *pbVar7;
        pbVar11 = pbVar11 + 1;
      }
    }
  }
LAB_00315761:
  pbVar6 = (byte *)*Fmt;
  pbVar7 = pbVar11;
  if (*pbVar6 == 0x2e) {
    *Fmt = (LPCSTR)(pbVar6 + 1);
    pbVar7 = pbVar11 + 1;
    *pbVar11 = *pbVar6;
    iVar1 = isdigit((uint)(byte)**Fmt);
    pbVar6 = (byte *)*Fmt;
    if (iVar1 == 0) {
      if (*pbVar6 == 0x2a) {
        *Precision = -2;
        *Fmt = (LPCSTR)(pbVar6 + 1);
        pbVar11[1] = *pbVar6;
        pbVar7 = pbVar11 + 2;
        iVar1 = isdigit((uint)(byte)**Fmt);
        if (iVar1 != 0) {
          *Precision = -4;
          while (iVar1 = isdigit((uint)(byte)**Fmt), iVar1 != 0) {
            pbVar11 = (byte *)*Fmt;
            *Fmt = (LPCSTR)(pbVar11 + 1);
            *pbVar7 = *pbVar11;
            pbVar7 = pbVar7 + 1;
          }
        }
      }
      else {
        *Precision = -3;
      }
    }
    else {
      iVar1 = isdigit((uint)*pbVar6);
      pcVar9 = pcVar3;
      while (iVar1 != 0) {
        *pcVar9 = **Fmt;
        pcVar9 = pcVar9 + 1;
        pbVar11 = (byte *)*Fmt;
        *Fmt = (LPCSTR)(pbVar11 + 1);
        *pbVar7 = *pbVar11;
        pbVar7 = pbVar7 + 1;
        iVar1 = isdigit((uint)(byte)**Fmt);
      }
      *pcVar9 = '\0';
      iVar1 = atoi(pcVar3);
      *Precision = iVar1;
      if (iVar1 < 0) goto LAB_003157e4;
    }
  }
  pbVar11 = (byte *)*Fmt;
  bVar5 = *pbVar11;
  if (bVar5 == 0x70) {
    *Prefix = 3;
    bVar5 = *pbVar11;
  }
  pbVar6 = pbVar11;
  if (bVar5 < 0x68) {
    if (bVar5 != 0x49) {
      if (bVar5 != 0x4c) goto LAB_00315912;
      goto LAB_003158d5;
    }
    if (pbVar11[1] == 0x33) {
      if (pbVar11[2] == 0x32) {
        pbVar6 = pbVar11 + 3;
        goto LAB_003158d8;
      }
LAB_00315903:
      pbVar6 = pbVar11 + 1;
    }
    else {
      if ((pbVar11[1] != 0x36) || (pbVar11[2] != 0x34)) goto LAB_00315903;
      pbVar6 = pbVar11 + 3;
    }
    *Fmt = (LPCSTR)pbVar6;
    *Prefix = 3;
  }
  else if (bVar5 == 0x68) {
    *Prefix = 1;
LAB_003158d5:
    pbVar6 = pbVar11 + 1;
LAB_003158d8:
    *Fmt = (LPCSTR)pbVar6;
  }
  else if ((bVar5 == 0x6c) || (bVar5 == 0x77)) {
    pbVar6 = pbVar11 + 1;
    *Fmt = (LPCSTR)pbVar6;
    bVar5 = pbVar11[1];
    if ((bVar5 | 0x10) == 0x73) {
      *Prefix = 2;
      bVar5 = *pbVar6;
    }
    if (bVar5 == 0x6c) {
      *Prefix = 3;
      pbVar6 = pbVar11 + 2;
      goto LAB_003158d8;
    }
  }
LAB_00315912:
  bVar5 = *pbVar6;
  if (bVar5 < 0x58) {
    if (bVar5 != 0x43) {
      if (bVar5 != 0x45) {
        if (bVar5 == 0x53) goto switchD_00315934_caseD_73;
        goto switchD_00315934_caseD_68;
      }
      goto switchD_00315934_caseD_65;
    }
switchD_00315934_caseD_63:
    *Type = 1;
    if (*Prefix != 1) {
      if (*pbVar6 == 0x43) {
        *Prefix = 2;
      }
      else if (*Prefix != 2) goto LAB_00315a16;
      *pbVar7 = 0x6c;
      pbVar7 = pbVar7 + 1;
    }
LAB_00315a16:
    *pbVar7 = 99;
LAB_00315a1a:
    pbVar7 = pbVar7 + 1;
    *Fmt = *Fmt + 1;
  }
  else {
    switch(bVar5) {
    case 99:
      goto switchD_00315934_caseD_63;
    case 100:
    case 0x69:
    case 0x6f:
    case 0x75:
    case 0x78:
      goto switchD_00315934_caseD_64;
    case 0x65:
    case 0x66:
    case 0x67:
switchD_00315934_caseD_65:
      *Type = 7;
      goto LAB_003159e7;
    case 0x68:
    case 0x6a:
    case 0x6b:
    case 0x6c:
    case 0x6d:
    case 0x6e:
    case 0x70:
    case 0x71:
    case 0x72:
    case 0x74:
    case 0x76:
    case 0x77:
switchD_00315934_caseD_68:
      if (bVar5 != 0x70) {
        if (bVar5 != 0x6e) {
          BVar10 = 0;
          if (bVar5 != 0x47) goto LAB_00315a26;
          goto switchD_00315934_caseD_65;
        }
        if (*Prefix == 1) {
          *pbVar7 = 0x68;
          pbVar7 = pbVar7 + 1;
          pbVar6 = (byte *)*Fmt;
        }
        *Fmt = (LPCSTR)(pbVar6 + 1);
        *pbVar7 = *pbVar6;
        pbVar7 = pbVar7 + 1;
        *Type = 6;
        goto LAB_00315a20;
      }
      *Type = 5;
      *Fmt = (LPCSTR)(pbVar6 + 1);
      if (*Prefix == 3) {
        if (*Precision == -1) {
          *Precision = 0x10;
          pbVar7[0] = 0x2e;
          pbVar7[1] = 0x31;
          pbVar7[2] = 0x36;
          pbVar7 = pbVar7 + 3;
        }
        pbVar7[0] = 0x6c;
        pbVar7[1] = 0x6c;
LAB_00315abc:
        pbVar7 = pbVar7 + 2;
      }
      else if (*Precision == -1) {
        *Precision = 8;
        pbVar7[0] = 0x2e;
        pbVar7[1] = 0x38;
        goto LAB_00315abc;
      }
      *pbVar7 = 0x58;
      goto LAB_003159f3;
    case 0x73:
switchD_00315934_caseD_73:
      *Type = 2;
      if (*Prefix != 1) {
        if (*pbVar6 == 0x53) {
          *Prefix = 2;
        }
        else if (*Prefix != 2) goto LAB_00315a04;
        *pbVar7 = 0x6c;
        pbVar7 = pbVar7 + 1;
      }
LAB_00315a04:
      *pbVar7 = 0x73;
      goto LAB_00315a1a;
    }
    if (bVar5 != 0x58) goto switchD_00315934_caseD_68;
switchD_00315934_caseD_64:
    *Type = 4;
    iVar1 = *Prefix;
    if (iVar1 == 3) {
      pbVar7[0] = 0x6c;
      pbVar7[1] = 0x6c;
      pbVar7 = pbVar7 + 2;
    }
    else {
      if (iVar1 == 2) {
        *pbVar7 = 0x6c;
      }
      else {
        if (iVar1 != 1) goto LAB_003159b9;
        *pbVar7 = 0x68;
      }
      pbVar7 = pbVar7 + 1;
    }
LAB_003159b9:
    pbVar6 = (byte *)*Fmt;
LAB_003159e7:
    *Fmt = (LPCSTR)(pbVar6 + 1);
    *pbVar7 = *pbVar6;
LAB_003159f3:
    pbVar7 = pbVar7 + 1;
  }
LAB_00315a20:
  BVar10 = 1;
LAB_00315a26:
  *pbVar7 = 0;
  CorUnix::InternalFree(pcVar3);
  return BVar10;
}

Assistant:

BOOL Internal_ExtractFormatA(CPalThread *pthrCurrent, LPCSTR *Fmt, LPSTR Out, LPINT Flags,
    LPINT Width, LPINT Precision, LPINT Prefix, LPINT Type)
{
    BOOL Result = FALSE;
    LPSTR TempStr;
    LPSTR TempStrPtr;

    *Width = WIDTH_DEFAULT;
    *Precision = PRECISION_DEFAULT;
    *Flags = PFF_NONE;
    *Prefix = PFF_PREFIX_DEFAULT;
    *Type = PFF_TYPE_DEFAULT;

    if (*Fmt && **Fmt == '%')
    {
        *Out++ = *(*Fmt)++;
    }
    else
    {
        return Result;
    }

    /* we'll never need a temp string longer than the original */
    TempStrPtr = TempStr = (LPSTR) InternalMalloc(strlen(*Fmt)+1);
    if (!TempStr)
    {
        ERROR("InternalMalloc failed\n");
        pthrCurrent->SetLastError(ERROR_NOT_ENOUGH_MEMORY);
        return Result;
    }

    /* parse flags */
    while (**Fmt && (**Fmt == '-' || **Fmt == '+' ||
           **Fmt == '0' || **Fmt == ' ' || **Fmt == '#'))
    {
        switch (**Fmt)
        {
        case '-':
            *Flags |= PFF_MINUS; break;
        case '+':
            *Flags |= PFF_PLUS; break;
        case '0':
            *Flags |= PFF_ZERO; break;
        case ' ':
            *Flags |= PFF_SPACE; break;
        case '#':
            *Flags |= PFF_POUND; break;
        }
            *Out++ = *(*Fmt)++;
    }
    /* '-' flag negates '0' flag */
    if ((*Flags & PFF_MINUS) && (*Flags & PFF_ZERO))
    {
        *Flags -= PFF_ZERO;
    }

    /* grab width specifier */
    if (isdigit((unsigned char) **Fmt))
    {
        TempStrPtr = TempStr;
        while (isdigit((unsigned char) **Fmt))
        {
            *TempStrPtr++ = **Fmt;
            *Out++ = *(*Fmt)++;
        }
        *TempStrPtr = 0; /* end string */
        *Width = atoi(TempStr);
        if (*Width < 0)
        {
            ERROR("atoi returned a negative value indicative of an overflow.\n");
            pthrCurrent->SetLastError(ERROR_INTERNAL_ERROR);
            return Result;
        }
    }
    else if (**Fmt == '*')
    {
        *Width = WIDTH_STAR;
        *Out++ = *(*Fmt)++;
        if (isdigit((unsigned char) **Fmt))
        {
            /* this is an invalid width because we have a * then a number */
            /* printf handles this by just printing the whole string */
            *Width = WIDTH_INVALID;
            while (isdigit((unsigned char) **Fmt))
            {
               *Out++ = *(*Fmt)++;
            }
        }
    }


    /* grab precision specifier */
    if (**Fmt == '.')
    {
        *Out++ = *(*Fmt)++;
        if (isdigit((unsigned char) **Fmt))
        {
            TempStrPtr = TempStr;
            while (isdigit((unsigned char) **Fmt))
            {
                *TempStrPtr++ = **Fmt;
                *Out++ = *(*Fmt)++;
            }
            *TempStrPtr = 0; /* end string */
            *Precision = atoi(TempStr);
            if (*Precision < 0)
            {
                ERROR("atoi returned a negative value indicative of an overflow.\n");
                pthrCurrent->SetLastError(ERROR_INTERNAL_ERROR);
                return Result;
            }
        }
        else if (**Fmt == '*')
        {
            *Precision = PRECISION_STAR;
            *Out++ = *(*Fmt)++;
            if (isdigit((unsigned char) **Fmt))
            {
                /* this is an invalid precision because we have a .* then a number */
                /* printf handles this by just printing the whole string */
                *Precision = PRECISION_INVALID;
                while (isdigit((unsigned char) **Fmt))
                {
                    *Out++ = *(*Fmt)++;
                }
            }
        }
        else
        {
            *Precision = PRECISION_DOT;
        }
    }

#ifdef BIT64
    if (**Fmt == 'p')
    {
        *Prefix = PFF_PREFIX_LONGLONG;
    }
#endif
    if ((*Fmt)[0] == 'I')
    {
        /* grab prefix of 'I64' for __int64 */
        if ((*Fmt)[1] == '6' && (*Fmt)[2] == '4')
        {
            /* convert to 'll' so that Unix snprintf can handle it */
            *Fmt += 3;
            *Prefix = PFF_PREFIX_LONGLONG;
        }
        /* grab prefix of 'I32' for __int32 */
        else if ((*Fmt)[1] == '3' && (*Fmt)[2] == '2')
        {
            *Fmt += 3;
        }
        else
        {
            ++(*Fmt);
    #ifdef BIT64
            /* convert to 'll' so that Unix snprintf can handle it */
            *Prefix = PFF_PREFIX_LONGLONG;
    #endif
        }
    }
    /* grab a prefix of 'h' */
    else if (**Fmt == 'h')
    {
        *Prefix = PFF_PREFIX_SHORT;
        ++(*Fmt);
    }
    /* grab prefix of 'l' or the undocumented 'w' (at least in MSDN) */
    else if (**Fmt == 'l' || **Fmt == 'w')
    {
        ++(*Fmt);
#ifdef BIT64
        // Only want to change the prefix on 64 bit when printing characters.
        if (**Fmt == 'c' || **Fmt == 's')
#endif
        {
            *Prefix = PFF_PREFIX_LONG;
        }
        if (**Fmt == 'l')
        {
            *Prefix = PFF_PREFIX_LONGLONG;
            ++(*Fmt);
        }
    }
    else if (**Fmt == 'L')
    {
        /* a prefix of 'L' seems to be ignored */
        ++(*Fmt);
    }

    /* grab type 'c' */
    if (**Fmt == 'c' || **Fmt == 'C')
    {
        *Type = PFF_TYPE_CHAR;
        if (*Prefix != PFF_PREFIX_SHORT && **Fmt == 'C')
        {
            *Prefix = PFF_PREFIX_LONG; /* give it a wide prefix */
        }
        if (*Prefix == PFF_PREFIX_LONG)
        {
            *Out++ = 'l';
        }
        *Out++ = 'c';
        ++(*Fmt);
        Result = TRUE;
    }
    /* grab type 's' */
    else if (**Fmt == 's' || **Fmt == 'S')
    {
        *Type = PFF_TYPE_STRING;
        if (*Prefix != PFF_PREFIX_SHORT && **Fmt == 'S')
        {
            *Prefix = PFF_PREFIX_LONG; /* give it a wide prefix */
        }
        if (*Prefix == PFF_PREFIX_LONG)
        {
            *Out++ = 'l';
        }
        *Out++ = 's';
        ++(*Fmt);
        Result = TRUE;
    }
    /* grab int types */
    else if (**Fmt == 'd' || **Fmt == 'i' || **Fmt == 'o' ||
             **Fmt == 'u' || **Fmt == 'x' || **Fmt == 'X')
    {
        *Type = PFF_TYPE_INT;
        if (*Prefix == PFF_PREFIX_SHORT)
        {
            *Out++ = 'h';
        }
        else if (*Prefix == PFF_PREFIX_LONG)
        {
            *Out++ = 'l';
        }
        else if (*Prefix == PFF_PREFIX_LONGLONG)
        {
            *Out++ = 'l';
            *Out++ = 'l';
        }
        *Out++ = *(*Fmt)++;
        Result = TRUE;
    }
    else if (**Fmt == 'e' || **Fmt == 'E' || **Fmt == 'f' ||
             **Fmt == 'g' || **Fmt == 'G')
    {
        /* we can safely ignore the prefixes and only add the type*/
        *Type = PFF_TYPE_FLOAT;
        *Out++ = *(*Fmt)++;
        Result = TRUE;
    }
    else if (**Fmt == 'n')
    {
        if (*Prefix == PFF_PREFIX_SHORT)
        {
            *Out++ = 'h';
        }
        *Out++ = *(*Fmt)++;
        *Type = PFF_TYPE_N;
        Result = TRUE;
    }
    else if (**Fmt == 'p')
    {
        *Type = PFF_TYPE_P;
        (*Fmt)++;

        if (*Prefix == PFF_PREFIX_LONGLONG)
        {
            if (*Precision == PRECISION_DEFAULT)
            {
                *Precision = 16;
                *Out++ = '.';
                *Out++ = '1';
                *Out++ = '6';
            }
            /* native *printf does not support %I64p
               (actually %llp), so we need to cheat a little bit */
            *Out++ = 'l';
            *Out++ = 'l';
        }
        else
        {
            if (*Precision == PRECISION_DEFAULT)
            {
                *Precision = 8;
                *Out++ = '.';
                *Out++ = '8';
            }
        }
        *Out++ = 'X';
        Result = TRUE;
    }

    *Out = 0;  /* end the string */
    InternalFree(TempStr);
    return Result;
}